

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,uint16_t reliableSequenceNumber,uint8_t channelID)

{
  ushort *puVar1;
  _ENetListNode **pp_Var2;
  byte *pbVar3;
  ENetList *pEVar4;
  ENetChannel *pEVar5;
  _ENetListNode *p_Var6;
  _ENetListNode *p_Var7;
  bool bVar8;
  byte bVar9;
  short sVar10;
  _ENetListNode *p_Var11;
  
  pEVar4 = &peer->sentReliableCommands;
  for (p_Var11 = (peer->sentReliableCommands).sentinel.next; p_Var11 != &pEVar4->sentinel;
      p_Var11 = p_Var11->next) {
    if ((*(uint16_t *)&p_Var11[1].next == reliableSequenceNumber) &&
       (*(uint8_t *)((long)&p_Var11[2].previous + 1) == channelID)) {
      bVar8 = false;
      goto LAB_001082d1;
    }
  }
  p_Var11 = (peer->outgoingCommands).sentinel.next;
  do {
    if ((p_Var11 == &(peer->outgoingCommands).sentinel) ||
       (*(short *)((long)&p_Var11[2].next + 6) == 0)) {
      bVar9 = 0;
LAB_00108378:
      return (ENetProtocolCommand)bVar9;
    }
    if ((*(uint16_t *)&p_Var11[1].next == reliableSequenceNumber) &&
       (*(uint8_t *)((long)&p_Var11[2].previous + 1) == channelID)) {
      bVar8 = true;
LAB_001082d1:
      if ((ulong)channelID < peer->channelCount) {
        pEVar5 = peer->channels;
        sVar10 = *(short *)((long)pEVar5->reliableWindows +
                           (ulong)(reliableSequenceNumber >> 0xc) * 2 +
                           (ulong)((uint)channelID * 0x50));
        if (sVar10 != 0) {
          sVar10 = sVar10 + -1;
          *(short *)((long)pEVar5->reliableWindows +
                    (ulong)(reliableSequenceNumber >> 0xc) * 2 + (ulong)((uint)channelID * 0x50)) =
               sVar10;
          if (sVar10 == 0) {
            bVar9 = (byte)(reliableSequenceNumber >> 0xc);
            puVar1 = (ushort *)
                     ((long)pEVar5->reliableWindows + ((ulong)((uint)channelID * 0x50) - 2));
            *puVar1 = *puVar1 & (-2 << bVar9 | 0xfffeU >> 0x10 - bVar9);
          }
        }
      }
      bVar9 = *(byte *)&p_Var11[2].previous;
      p_Var6 = p_Var11->next;
      p_Var7 = p_Var11->previous;
      p_Var7->next = p_Var6;
      p_Var6->previous = p_Var7;
      p_Var6 = p_Var11[5].previous;
      if (p_Var6 != (_ENetListNode *)0x0) {
        if (!bVar8) {
          peer->reliableDataInTransit =
               peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var11[2].next + 4);
        }
        pp_Var2 = &p_Var6[1].previous;
        *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
        if (*(int *)pp_Var2 == 0) {
          pbVar3 = (byte *)((long)&p_Var6->next + 1);
          *pbVar3 = *pbVar3 | 1;
          if (p_Var6[1].next != (_ENetListNode *)0x0) {
            (*(code *)p_Var6[1].next)(p_Var6);
          }
          (*(code *)callbacks_1)(p_Var6);
        }
      }
      bVar9 = bVar9 & 0xf;
      (*(code *)callbacks_1)(p_Var11);
      p_Var11 = (pEVar4->sentinel).next;
      if (p_Var11 != &pEVar4->sentinel) {
        peer->nextTimeout = *(int *)&p_Var11[1].previous + *(int *)((long)&p_Var11[1].next + 4);
      }
      goto LAB_00108378;
    }
    p_Var11 = p_Var11->next;
  } while( true );
}

Assistant:

static ENetProtocolCommand enet_protocol_remove_sent_reliable_command(ENetPeer* peer, uint16_t reliableSequenceNumber, uint8_t channelID) {
	ENetOutgoingCommand* outgoingCommand = NULL;
	ENetListIterator currentCommand;
	ENetProtocolCommand commandNumber;

	int wasSent = 1;

	for (currentCommand = enet_list_begin(&peer->sentReliableCommands); currentCommand != enet_list_end(&peer->sentReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
			break;
	}

	if (currentCommand == enet_list_end(&peer->sentReliableCommands)) {
		for (currentCommand = enet_list_begin(&peer->outgoingCommands); currentCommand != enet_list_end(&peer->outgoingCommands); currentCommand = enet_list_next(currentCommand)) {
			outgoingCommand = (ENetOutgoingCommand*)currentCommand;

			if (outgoingCommand->sendAttempts < 1)
				return ENET_PROTOCOL_COMMAND_NONE;

			if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
				break;
		}

		if (currentCommand == enet_list_end(&peer->outgoingCommands))
			return ENET_PROTOCOL_COMMAND_NONE;

		wasSent = 0;
	}

	if (outgoingCommand == NULL)
		return ENET_PROTOCOL_COMMAND_NONE;

	if (channelID < peer->channelCount) {
		ENetChannel* channel = &peer->channels[channelID];
		uint16_t reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

		if (channel->reliableWindows[reliableWindow] > 0) {
			--channel->reliableWindows[reliableWindow];

			if (!channel->reliableWindows[reliableWindow])
				channel->usedReliableWindows &= ~(1 << reliableWindow);
		}
	}

	commandNumber = (ENetProtocolCommand)(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK);

	enet_list_remove(&outgoingCommand->outgoingCommandList);

	if (outgoingCommand->packet != NULL) {
		if (wasSent)
			peer->reliableDataInTransit -= outgoingCommand->fragmentLength;

		--outgoingCommand->packet->referenceCount;

		if (outgoingCommand->packet->referenceCount == 0) {
			outgoingCommand->packet->flags |= ENET_PACKET_FLAG_SENT;

			enet_packet_destroy(outgoingCommand->packet);
		}
	}

	enet_free(outgoingCommand);

	if (enet_list_empty(&peer->sentReliableCommands))
		return commandNumber;

	outgoingCommand = (ENetOutgoingCommand*)enet_list_front(&peer->sentReliableCommands);
	peer->nextTimeout = outgoingCommand->sentTime + outgoingCommand->roundTripTimeout;

	return commandNumber;
}